

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

bool __thiscall
vkt::QueryPool::anon_unknown_0::GraphicBasicTestInstance::checkImage(GraphicBasicTestInstance *this)

{
  VkOffset3D offset;
  bool bVar1;
  VkQueue queue_00;
  Image *this_00;
  Allocator *allocator;
  PixelBufferAccess *pPVar2;
  const_reference pvVar3;
  TestContext *this_01;
  TestLog *log;
  ConstPixelBufferAccess *reference;
  Vector<float,_4> local_fc;
  int local_ec;
  int local_e8;
  int x_3;
  int y_3;
  int x_2;
  int y_2;
  int x_1;
  int y_1;
  int x;
  int y;
  TextureFormat local_c0;
  undefined1 local_b8 [8];
  Texture2D referenceFrame;
  int colorNdx;
  undefined1 local_50 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  VkQueue queue;
  GraphicBasicTestInstance *this_local;
  
  queue_00 = Context::getUniversalQueue
                       ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  renderedFrame.m_data = (void *)0x0;
  this_00 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_colorAttachmentImage);
  allocator = Context::getDefaultAllocator
                        ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  offset.z = 0;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_50,this_00,queue_00,allocator,VK_IMAGE_LAYOUT_GENERAL,
             offset,0x40,0x40,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  referenceFrame.m_view.m_levels._4_4_ = 0;
  local_c0 = ::vk::mapVkFormat(this->m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D((Texture2D *)local_b8,&local_c0,0x40,0x40);
  tcu::Texture2D::allocLevel((Texture2D *)local_b8,0);
  for (y_1 = 0; y_1 < 0x20; y_1 = y_1 + 1) {
    for (x_1 = 0; x_1 < 0x20; x_1 = x_1 + 1) {
      pPVar2 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_b8,0);
      pvVar3 = std::
               vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
               ::operator[](this->m_data,(long)referenceFrame.m_view.m_levels._4_4_);
      tcu::PixelBufferAccess::setPixel(pPVar2,&pvVar3->color,x_1,y_1,0);
    }
  }
  referenceFrame.m_view.m_levels._4_4_ = referenceFrame.m_view.m_levels._4_4_ + 4;
  for (y_2 = 0x20; y_2 < 0x40; y_2 = y_2 + 1) {
    for (x_2 = 0; x_2 < 0x20; x_2 = x_2 + 1) {
      pPVar2 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_b8,0);
      pvVar3 = std::
               vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
               ::operator[](this->m_data,(long)referenceFrame.m_view.m_levels._4_4_);
      tcu::PixelBufferAccess::setPixel(pPVar2,&pvVar3->color,x_2,y_2,0);
    }
  }
  referenceFrame.m_view.m_levels._4_4_ = referenceFrame.m_view.m_levels._4_4_ + 4;
  for (y_3 = 0; y_3 < 0x20; y_3 = y_3 + 1) {
    for (x_3 = 0x20; x_3 < 0x40; x_3 = x_3 + 1) {
      pPVar2 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_b8,0);
      pvVar3 = std::
               vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
               ::operator[](this->m_data,(long)referenceFrame.m_view.m_levels._4_4_);
      tcu::PixelBufferAccess::setPixel(pPVar2,&pvVar3->color,x_3,y_3,0);
    }
  }
  referenceFrame.m_view.m_levels._4_4_ = referenceFrame.m_view.m_levels._4_4_ + 4;
  for (local_e8 = 0x20; local_e8 < 0x40; local_e8 = local_e8 + 1) {
    for (local_ec = 0x20; local_ec < 0x40; local_ec = local_ec + 1) {
      pPVar2 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_b8,0);
      pvVar3 = std::
               vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
               ::operator[](this->m_data,(long)referenceFrame.m_view.m_levels._4_4_);
      tcu::PixelBufferAccess::setPixel(pPVar2,&pvVar3->color,local_ec,local_e8,0);
    }
  }
  this_01 = Context::getTestContext
                      ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  log = tcu::TestContext::getLog(this_01);
  reference = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_b8,0)->
               super_ConstPixelBufferAccess;
  tcu::Vector<float,_4>::Vector(&local_fc,0.01);
  bVar1 = tcu::floatThresholdCompare
                    (log,"Result","Image comparison result",reference,
                     (ConstPixelBufferAccess *)local_50,&local_fc,COMPARE_LOG_ON_ERROR);
  tcu::Texture2D::~Texture2D((Texture2D *)local_b8);
  return bVar1;
}

Assistant:

bool GraphicBasicTestInstance::checkImage (void)
{
	const VkQueue						queue			= m_context.getUniversalQueue();
	const VkOffset3D					zeroOffset		= { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess	renderedFrame	= m_colorAttachmentImage->readSurface(queue, m_context.getDefaultAllocator(),
															VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, VK_IMAGE_ASPECT_COLOR_BIT);
	int									colorNdx		= 0;
	tcu::Texture2D						referenceFrame	(mapVkFormat(m_colorAttachmentFormat), WIDTH, HEIGHT);
	referenceFrame.allocLevel(0);

	for (int y = 0; y < HEIGHT/2; ++y)
	for (int x = 0; x < WIDTH/2; ++x)
			referenceFrame.getLevel(0).setPixel(m_data[colorNdx].color, x, y);

	colorNdx += 4;
	for (int y =  HEIGHT/2; y < HEIGHT; ++y)
	for (int x = 0; x < WIDTH/2; ++x)
			referenceFrame.getLevel(0).setPixel(m_data[colorNdx].color, x, y);

	colorNdx += 4;
	for (int y = 0; y < HEIGHT/2; ++y)
	for (int x =  WIDTH/2; x < WIDTH; ++x)
			referenceFrame.getLevel(0).setPixel(m_data[colorNdx].color, x, y);

	colorNdx += 4;
	for (int y =  HEIGHT/2; y < HEIGHT; ++y)
	for (int x =  WIDTH/2; x < WIDTH; ++x)
			referenceFrame.getLevel(0).setPixel(m_data[colorNdx].color, x, y);

	return tcu::floatThresholdCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", referenceFrame.getLevel(0), renderedFrame, tcu::Vec4(0.01f), tcu::COMPARE_LOG_ON_ERROR);
}